

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

void __thiscall
rapidxml::xml_document<char>::parse_node_attributes<0>
          (xml_document<char> *this,char **text,xml_node<char> *node)

{
  char cVar1;
  byte *pbVar2;
  size_t sVar3;
  xml_attribute<char> *attribute;
  char *pcVar4;
  undefined8 *puVar5;
  char *pcVar6;
  
  while( true ) {
    pbVar2 = (byte *)*text;
    if (internal::lookup_tables<0>::lookup_attribute_name[*pbVar2] == '\0') {
      return;
    }
    *text = (char *)(pbVar2 + 1);
    skip<rapidxml::xml_document<char>::attribute_name_pred,0>(text);
    if ((byte *)*text == pbVar2) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
      *puVar5 = &PTR__exception_01198c58;
      puVar5[1] = "expected attribute name";
      puVar5[2] = pbVar2;
      goto LAB_00e4e0f3;
    }
    attribute = (xml_attribute<char> *)
                memory_pool<char>::allocate_aligned(&this->super_memory_pool<char>,0x38);
    (attribute->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
    (attribute->super_xml_base<char>).m_name = (char *)0x0;
    (attribute->super_xml_base<char>).m_value = (char *)0x0;
    pcVar6 = *text;
    (attribute->super_xml_base<char>).m_name = (char *)pbVar2;
    (attribute->super_xml_base<char>).m_name_size = (long)pcVar6 - (long)pbVar2;
    xml_node<char>::append_attribute(node,attribute);
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
    if (**text != '=') break;
    *text = *text + 1;
    pcVar6 = (attribute->super_xml_base<char>).m_name;
    sVar3 = (attribute->super_xml_base<char>).m_name_size;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &xml_base<char>::nullstr()::zero;
      sVar3 = 0;
    }
    pcVar6[sVar3] = '\0';
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
    cVar1 = **text;
    if ((cVar1 != '\"') && (cVar1 != '\'')) {
LAB_00e4e082:
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
      pcVar6 = *text;
      *puVar5 = &PTR__exception_01198c58;
      pcVar4 = "expected \' or \"";
      goto LAB_00e4e0eb;
    }
    pcVar6 = *text + 1;
    *text = pcVar6;
    if (cVar1 == '\'') {
      pcVar4 = skip_and_expand_character_refs<rapidxml::xml_document<char>::attribute_value_pred<(char)39>,rapidxml::xml_document<char>::attribute_value_pure_pred<(char)39>,0>
                         (text);
    }
    else {
      pcVar4 = skip_and_expand_character_refs<rapidxml::xml_document<char>::attribute_value_pred<(char)34>,rapidxml::xml_document<char>::attribute_value_pure_pred<(char)34>,0>
                         (text);
    }
    (attribute->super_xml_base<char>).m_value = pcVar6;
    (attribute->super_xml_base<char>).m_value_size = (long)pcVar4 - (long)pcVar6;
    if (**text != cVar1) goto LAB_00e4e082;
    *text = *text + 1;
    pcVar6 = (attribute->super_xml_base<char>).m_value;
    sVar3 = (attribute->super_xml_base<char>).m_value_size;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &xml_base<char>::nullstr()::zero;
      sVar3 = 0;
    }
    pcVar6[sVar3] = '\0';
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
  pcVar6 = *text;
  *puVar5 = &PTR__exception_01198c58;
  pcVar4 = "expected =";
LAB_00e4e0eb:
  puVar5[1] = pcVar4;
  puVar5[2] = pcVar6;
LAB_00e4e0f3:
  __cxa_throw(puVar5,&parse_error::typeinfo,std::exception::~exception);
}

Assistant:

void parse_node_attributes(Ch *&text, xml_node<Ch> *node)
        {
            // For all attributes 
            while (attribute_name_pred::test(*text))
            {
                // Extract attribute name
                Ch *name = text;
                ++text;     // Skip first character of attribute name
                skip<attribute_name_pred, Flags>(text);
                if (text == name)
                    RAPIDXML_PARSE_ERROR("expected attribute name", name);

                // Create new attribute
                xml_attribute<Ch> *attribute = this->allocate_attribute();
                attribute->name(name, text - name);
                node->append_attribute(attribute);

                // Skip whitespace after attribute name
                skip<whitespace_pred, Flags>(text);

                // Skip =
                if (*text != Ch('='))
                    RAPIDXML_PARSE_ERROR("expected =", text);
                ++text;

                // Add terminating zero after name
                if (!(Flags & parse_no_string_terminators))
                    attribute->name()[attribute->name_size()] = 0;

                // Skip whitespace after =
                skip<whitespace_pred, Flags>(text);

                // Skip quote and remember if it was ' or "
                Ch quote = *text;
                if (quote != Ch('\'') && quote != Ch('"'))
                    RAPIDXML_PARSE_ERROR("expected ' or \"", text);
                ++text;

                // Extract attribute value and expand char refs in it
                Ch *value = text, *end;
                const int AttFlags = Flags & ~parse_normalize_whitespace;   // No whitespace normalization in attributes
                if (quote == Ch('\''))
                    end = skip_and_expand_character_refs<attribute_value_pred<Ch('\'')>, attribute_value_pure_pred<Ch('\'')>, AttFlags>(text);
                else
                    end = skip_and_expand_character_refs<attribute_value_pred<Ch('"')>, attribute_value_pure_pred<Ch('"')>, AttFlags>(text);
                
                // Set attribute value
                attribute->value(value, end - value);
                
                // Make sure that end quote is present
                if (*text != quote)
                    RAPIDXML_PARSE_ERROR("expected ' or \"", text);
                ++text;     // Skip quote

                // Add terminating zero after value
                if (!(Flags & parse_no_string_terminators))
                    attribute->value()[attribute->value_size()] = 0;

                // Skip whitespace after attribute value
                skip<whitespace_pred, Flags>(text);
            }
        }